

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  allocator<char> local_76;
  allocator<char> local_75;
  undefined4 local_74;
  undefined1 local_70 [8];
  string ret;
  size_type slash_pos;
  undefined1 local_38 [8];
  string fn;
  string *filename_local;
  
  fn.field_2._8_8_ = filename;
  std::__cxx11::string::string((string *)local_38,(string *)filename);
  ConvertToUnixSlashes((string *)local_38);
  ret.field_2._8_8_ = std::__cxx11::string::rfind(local_38,0x8dceb5);
  if (ret.field_2._8_8_ == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_76);
    std::allocator<char>::~allocator(&local_76);
    local_74 = 1;
    goto LAB_0063205a;
  }
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 2) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
    if (*pcVar2 != ':') goto LAB_00631f74;
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,'/'
                  );
  }
  else {
LAB_00631f74:
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_70);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"/",&local_75);
      std::allocator<char>::~allocator(&local_75);
    }
  }
  local_74 = 1;
  std::__cxx11::string::~string((string *)local_70);
LAB_0063205a:
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind("/");
  if (slash_pos != std::string::npos) {
    std::string ret = fn.substr(0, slash_pos);
    if (ret.size() == 2 && ret[1] == ':') {
      return ret + '/';
    }
    if (ret.empty()) {
      return "/";
    }
    return ret;
  } else {
    return "";
  }
}